

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O1

repl_p_entry * repl_p_lru_insert(repl_p_head *head,void *element,repl_p_entry **ptr_entry)

{
  repl_p_entry *prVar1;
  repl_p_entry **pprVar2;
  int iVar3;
  repl_p_entry *prVar4;
  int *piVar5;
  
  prVar4 = (repl_p_entry *)Zalloc(0x20);
  if (prVar4 == (repl_p_entry *)0x0) {
    prVar4 = (repl_p_entry *)0x0;
  }
  else {
    prVar4->data = element;
    prVar4->ptr_entry = ptr_entry;
    LOCK();
    prVar1 = *ptr_entry;
    if (prVar1 == (repl_p_entry *)0x0) {
      *ptr_entry = prVar4;
    }
    UNLOCK();
    if (prVar1 != (repl_p_entry *)0x0) {
      abort();
    }
    iVar3 = os_mutex_lock(&head->lock);
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      *piVar5 = iVar3;
      abort();
    }
    vmemcache_entry_acquire((cache_entry *)element);
    (prVar4->node).tqe_next = (repl_p_entry *)0x0;
    pprVar2 = (head->first).tqh_last;
    (prVar4->node).tqe_prev = pprVar2;
    *pprVar2 = prVar4;
    (head->first).tqh_last = (repl_p_entry **)prVar4;
    iVar3 = os_mutex_unlock(&head->lock);
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      *piVar5 = iVar3;
      abort();
    }
  }
  return prVar4;
}

Assistant:

static struct repl_p_entry *
repl_p_lru_insert(struct repl_p_head *head, void *element,
			struct repl_p_entry **ptr_entry)
{
	struct repl_p_entry *entry = Zalloc(sizeof(struct repl_p_entry));
	if (entry == NULL)
		return NULL;

	entry->data = element;

	ASSERTne(ptr_entry, NULL);
	entry->ptr_entry = ptr_entry;

	/*
	 * 'util_bool_compare_and_swap64' must always succeed here,
	 * because this entry with ptr_entry=NULL has been considered as busy
	 * so it has never been used so far. This is the first time we set
	 * the 'entry->ptr_entry' to 'entry'.
	 */
	int rv = util_bool_compare_and_swap64(entry->ptr_entry, NULL, entry);
	if (rv == 0) {
		FATAL(
			"repl_p_lru_insert(): failed to initialize pointer to the LRU list");
	}

	util_mutex_lock(&head->lock);

	vmemcache_entry_acquire(element);
	TAILQ_INSERT_TAIL(&head->first, entry, node);

	util_mutex_unlock(&head->lock);

	return entry;
}